

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O0

ostream * pstack::operator<<(ostream *os,JSON<pstack::Dwarf::UnitType,_char> *ut)

{
  UnitType UVar1;
  char local_f5;
  UnitType local_f4;
  JSON<int,_char> local_f0;
  char local_d9;
  JSON<char[14],_char> local_d8;
  char local_c1;
  JSON<char[14],_char> local_c0;
  char local_a9;
  JSON<char[17],_char> local_a8;
  char local_91;
  JSON<char[20],_char> local_90;
  char local_79;
  JSON<char[15],_char> local_78;
  char local_61;
  JSON<char[14],_char> local_60;
  char local_49;
  JSON<char[11],_char> local_48;
  char local_31;
  JSON<char[14],_char> local_30;
  JSON<pstack::Dwarf::UnitType,_char> *local_20;
  JSON<pstack::Dwarf::UnitType,_char> *ut_local;
  ostream *os_local;
  
  UVar1 = *ut->object;
  local_20 = ut;
  ut_local = (JSON<pstack::Dwarf::UnitType,_char> *)os;
  if (UVar1 == DW_UT_compile) {
    local_31 = '\0';
    local_30 = json<char[14],char>((char (*) [14])"DW_UT_compile",&local_31);
    os_local = operator<<(os,&local_30);
  }
  else if (UVar1 == DW_UT_type) {
    local_49 = '\0';
    local_48 = json<char[11],char>((char (*) [11])"DW_UT_type",&local_49);
    os_local = operator<<(os,&local_48);
  }
  else if (UVar1 == DW_UT_partial) {
    local_61 = '\0';
    local_60 = json<char[14],char>((char (*) [14])"DW_UT_partial",&local_61);
    os_local = operator<<(os,&local_60);
  }
  else if (UVar1 == DW_UT_skeleton) {
    local_79 = '\0';
    local_78 = json<char[15],char>((char (*) [15])"DW_UT_skeleton",&local_79);
    os_local = operator<<(os,&local_78);
  }
  else if (UVar1 == DW_UT_split_compile) {
    local_91 = '\0';
    local_90 = json<char[20],char>((char (*) [20])"DW_UT_split_compile",&local_91);
    os_local = operator<<(os,&local_90);
  }
  else if (UVar1 == DW_UT_split_type) {
    local_a9 = '\0';
    local_a8 = json<char[17],char>((char (*) [17])"DW_UT_split_type",&local_a9);
    os_local = operator<<(os,&local_a8);
  }
  else if (UVar1 == DW_UT_lo_user) {
    local_c1 = '\0';
    local_c0 = json<char[14],char>((char (*) [14])"DW_UT_lo_user",&local_c1);
    os_local = operator<<(os,&local_c0);
  }
  else if (UVar1 == DW_UT_hi_user) {
    local_d9 = '\0';
    local_d8 = json<char[14],char>((char (*) [14])"DW_UT_hi_user",&local_d9);
    os_local = operator<<(os,&local_d8);
  }
  else {
    local_f4 = *ut->object;
    local_f5 = '\0';
    local_f0 = json<int,char>((int *)&local_f4,&local_f5);
    os_local = operator<<(os,&local_f0);
  }
  return os_local;
}

Assistant:

std::ostream & operator << (std::ostream &os, const JSON<Dwarf::UnitType> &ut) {
#define DWARF_UNIT_TYPE(x,y) case Dwarf::x: return os << json(#x);
    switch (ut.object) {
#include "libpstack/dwarf/unittype.h"
    default: return os << json(int(ut.object));
    }
#undef DWARF_UNIT_TYPE
}